

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O2

SVectorBase<double> * __thiscall
soplex::SVectorBase<double>::operator=(SVectorBase<double> *this,SVectorBase<double> *sv)

{
  int iVar1;
  int iVar2;
  Nonzero<double> *pNVar3;
  Nonzero<double> *pNVar4;
  bool bVar5;
  
  if (this != sv) {
    iVar1 = sv->memused;
    pNVar4 = this->m_elem;
    pNVar3 = sv->m_elem;
    iVar2 = 0;
    while (bVar5 = iVar1 != 0, iVar1 = iVar1 + -1, bVar5) {
      if ((pNVar3->val != 0.0) || (NAN(pNVar3->val))) {
        pNVar4->idx = pNVar3->idx;
        pNVar4->val = pNVar3->val;
        pNVar4 = pNVar4 + 1;
        iVar2 = iVar2 + 1;
      }
      pNVar3 = pNVar3 + 1;
    }
    this->memused = iVar2;
  }
  return this;
}

Assistant:

SVectorBase<R>& operator=(const SVectorBase<R>& sv)
   {
      if(this != &sv)
      {
         assert(max() >= sv.size());

         int i = sv.size();
         int nnz = 0;
         Nonzero<R>* e = m_elem;
         const Nonzero<R>* s = sv.m_elem;

         while(i--)
         {
            assert(e != nullptr);

            if(s->val != 0.0)
            {
               *e++ = *s;
               ++nnz;
            }

            ++s;
         }

         set_size(nnz);
      }

      return *this;
   }